

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_JoinTxOnly_Test::TestBody(Psbt_JoinTxOnly_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_260;
  Message local_258;
  string local_250;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_208 [8];
  Psbt psbt2;
  Message local_1b0;
  ByteData local_1a8;
  string local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  string local_158;
  undefined1 local_138 [8];
  Psbt psbt_txout_only;
  allocator local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  Psbt psbt_txin_only;
  Psbt psbt;
  Psbt_JoinTxOnly_Test *this_local;
  
  cfd::core::Psbt::Psbt
            ((Psbt *)&psbt_txin_only.base_tx_.vout_.
                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,
             "cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA=="
             ,&local_d1);
  cfd::core::Psbt::Psbt((Psbt *)local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_158,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::Psbt::Psbt((Psbt *)local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  cfd::core::Psbt::operator=
            ((Psbt *)&psbt_txin_only.base_tx_.vout_.
                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_b0);
  cfd::core::Psbt::Join
            ((Psbt *)&psbt_txin_only.base_tx_.vout_.
                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(Psbt *)local_138,true);
  cfd::core::Psbt::GetData
            (&local_1a8,
             (Psbt *)&psbt_txin_only.base_tx_.vout_.
                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_190,&local_1a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_170,
             "\"70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_190);
  cfd::core::ByteData::~ByteData(&local_1a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x281,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &psbt2.base_tx_.vout_.
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  cfd::core::Psbt::GetData
            ((ByteData *)&gtest_ar_1.message_,
             (Psbt *)&psbt_txin_only.base_tx_.vout_.
                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Psbt::Psbt((Psbt *)local_208,(ByteData *)&gtest_ar_1.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_1.message_);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_250,(Psbt *)local_208);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,
             "\"cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA="
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_250);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x283,pcVar2);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  cfd::core::Psbt::~Psbt((Psbt *)local_208);
  cfd::core::Psbt::~Psbt((Psbt *)local_138);
  cfd::core::Psbt::~Psbt((Psbt *)local_b0);
  cfd::core::Psbt::~Psbt
            ((Psbt *)&psbt_txin_only.base_tx_.vout_.
                      super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Psbt, JoinTxOnly) {
  Psbt psbt;
  Psbt psbt_txin_only("cHNidP8BAFwCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8AAAAAAAAAAA==");
  Psbt psbt_txout_only("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  psbt = psbt_txin_only;
  psbt.Join(psbt_txout_only, true);

  EXPECT_STREQ("70736274ff01009a0200000002267ffd76eae6b6c13ffb86ceabaa24d42485520233c2c3805e0ad764709578c00100000000ffffffff7d25462a42ff2cb1ba5401e5893259db3ca4bcf5cf6ab9715d35163d31c9ecc00000000000ffffffff0200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a555000000000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAJoCAAAAAiZ//Xbq5rbBP/uGzquqJNQkhVICM8LDgF4K12RwlXjAAQAAAAD/////fSVGKkL/LLG6VAHliTJZ2zykvPXParlxXTUWPTHJ7MAAAAAAAP////8CAOH1BQAAAAAWABSzIr3c5jO4UaxzcKtFTws2egZU5QDh9QUAAAAAFgAUyrjFOm6PwCltHNORWjB9UcSRpVUAAAAAAAAAAAA=", psbt2.GetBase64().c_str());
}